

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Offset<reflection::Service> __thiscall
flatbuffers::ServiceDef::Serialize(ServiceDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  string *psVar1;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  Offset<flatbuffers::String> declaration_file;
  Offset<reflection::Service> OVar2;
  pointer ppRVar3;
  string decl_file_in_project;
  string qualified_name;
  vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  servicecall_offsets;
  allocator<char> local_8d;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> local_8c;
  char *local_88;
  size_t local_80;
  string local_68;
  _Vector_base<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppRVar3 = (this->calls).vec.
                 super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppRVar3 !=
      (this->calls).vec.
      super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar3 = ppRVar3 + 1) {
    local_68._M_dataplus._M_p._0_4_ = RPCCall::Serialize(*ppRVar3,builder,parser);
    std::
    vector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>
    ::emplace_back<flatbuffers::Offset<reflection::RPCCall>>
              ((vector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>
                *)&local_48,(Offset<reflection::RPCCall> *)&local_68);
  }
  Namespace::GetFullyQualifiedName
            (&local_68,(this->super_Definition).defined_namespace,(string *)this,1000);
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,&local_68);
  local_8c = FlatBufferBuilderImpl<false>::
             CreateVector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>
                       (builder,(vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
                                 *)&local_48);
  attributes = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  documentation.o = 0;
  if (((parser->opts).binary_schema_comments == true) &&
     (documentation.o = 0,
     (this->super_Definition).doc_comment.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     (this->super_Definition).doc_comment.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    documentation =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  psVar1 = (this->super_Definition).declaration_file;
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_8d);
  }
  else {
    std::__cxx11::string::string((string *)&local_88,(string *)psVar1);
  }
  declaration_file = FlatBufferBuilderImpl<false>::CreateSharedString(builder,local_88,local_80);
  OVar2 = reflection::CreateService(builder,name,local_8c,attributes,documentation,declaration_file)
  ;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Vector_base<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  ::~_Vector_base(&local_48);
  return (Offset<reflection::Service>)OVar2.o;
}

Assistant:

Offset<reflection::Service> ServiceDef::Serialize(FlatBufferBuilder *builder,
                                                  const Parser &parser) const {
  std::vector<Offset<reflection::RPCCall>> servicecall_offsets;
  for (auto it = calls.vec.begin(); it != calls.vec.end(); ++it) {
    servicecall_offsets.push_back((*it)->Serialize(builder, parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto call__ = builder->CreateVector(servicecall_offsets);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateService(*builder, name__, call__, attr__, docs__,
                                   file__);
}